

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmResourceInfoCommon::GetSizeAuxSurface
          (GmmResourceInfoCommon *this,GMM_UNIFIED_AUX_TYPE GmmAuxType)

{
  int iVar1;
  undefined4 extraout_var;
  SKU_FEATURE_TABLE *pSVar2;
  undefined4 extraout_var_00;
  GMM_UNIFIED_AUX_TYPE GmmAuxType_local;
  GmmResourceInfoCommon *this_local;
  
  if (GmmAuxType == GMM_AUX_SURF) {
    this_local = (GmmResourceInfoCommon *)((this->AuxSurf).Size + (this->AuxSecSurf).Size);
  }
  else if (((GmmAuxType == GMM_AUX_CCS) || (GmmAuxType == GMM_AUX_HIZ)) ||
          (GmmAuxType == GMM_AUX_MCS)) {
    if (GmmAuxType == GMM_AUX_CCS) {
      iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
      pSVar2 = Context::GetSkuTable((Context *)CONCAT44(extraout_var,iVar1));
      if ((((ulong)pSVar2->field_1 >> 0x19 & 1) != 0) &&
         (((ulong)(this->Surf).Flags.Gpu >> 0x15 & 1) == 0)) {
        return 0;
      }
    }
    if (((GmmAuxType == GMM_AUX_CCS) && ((this->AuxSecSurf).Type != RESOURCE_INVALID)) &&
       ((((ulong)(this->Surf).Flags.Gpu >> 1 & 1) != 0 &&
        ((1 < (this->Surf).MSAA.NumSamples || (((ulong)(this->Surf).Flags.Gpu >> 6 & 1) != 0)))))) {
      this_local = (GmmResourceInfoCommon *)(this->AuxSecSurf).Size;
    }
    else {
      this_local = (GmmResourceInfoCommon *)(this->AuxSurf).UnpaddedSize;
    }
  }
  else if (GmmAuxType == GMM_AUX_COMP_STATE) {
    this_local = (GmmResourceInfoCommon *)0x40;
  }
  else if (GmmAuxType == GMM_AUX_CC) {
    if ((((ulong)(this->Surf).Flags.Gpu >> 0x25 & 1) == 0) &&
       (((ulong)(this->Surf).Flags.Gpu >> 10 & 1) != 0)) {
      this_local = (GmmResourceInfoCommon *)0x8;
    }
    else {
      iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
      pSVar2 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_00,iVar1));
      if (((ulong)pSVar2->field_1 >> 0x22 & 1) == 0) {
        this_local = (GmmResourceInfoCommon *)(this->AuxSurf).CCSize;
      }
      else if ((this->Surf).MSAA.NumSamples < 2) {
        this_local = (GmmResourceInfoCommon *)0x0;
      }
      else {
        this_local = (GmmResourceInfoCommon *)(this->AuxSurf).UnpaddedSize;
      }
    }
  }
  else if (GmmAuxType == GMM_AUX_ZCS) {
    if ((((ulong)(this->Surf).Flags.Gpu >> 0x25 & 1) == 0) ||
       ((this->AuxSecSurf).Type == RESOURCE_INVALID)) {
      this_local = (GmmResourceInfoCommon *)0x0;
    }
    else {
      this_local = (GmmResourceInfoCommon *)(this->AuxSecSurf).Size;
    }
  }
  else {
    this_local = (GmmResourceInfoCommon *)0x0;
  }
  return (GMM_GFX_SIZE_T)this_local;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_GFX_SIZE_T GMM_STDCALL GetSizeAuxSurface(GMM_UNIFIED_AUX_TYPE GmmAuxType)
            {
                if (GmmAuxType == GMM_AUX_SURF)
                {
                    return (AuxSurf.Size + AuxSecSurf.Size);
                }
                else if (GmmAuxType == GMM_AUX_CCS || GmmAuxType == GMM_AUX_HIZ || GmmAuxType == GMM_AUX_MCS)
                {
                    if(GmmAuxType == GMM_AUX_CCS &&
                       GetGmmLibContext()->GetSkuTable().FtrFlatPhysCCS && !Surf.Flags.Gpu.ProceduralTexture)
                    {
                        return 0;
                    }
                    if (GmmAuxType == GMM_AUX_CCS && AuxSecSurf.Type != RESOURCE_INVALID &&
                        (Surf.Flags.Gpu.CCS && (Surf.MSAA.NumSamples > 1 ||
                            Surf.Flags.Gpu.Depth)))
                    {
                        return AuxSecSurf.Size;
                    }
                    else
                    {
                        return (AuxSurf.UnpaddedSize);
                    }
                }
                else if (GmmAuxType == GMM_AUX_COMP_STATE)
                {
                    return GMM_MEDIA_COMPRESSION_STATE_SIZE;
                }
                else if (GmmAuxType == GMM_AUX_CC)
                {
                    if (!Surf.Flags.Gpu.UnifiedAuxSurface && Surf.Flags.Gpu.HiZ)
                    {
                        return GMM_HIZ_CLEAR_COLOR_SIZE;
                    }
                    else
                    {
                    
                        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
                        {
                            if (Surf.MSAA.NumSamples > 1)
                            {
                                return (AuxSurf.UnpaddedSize); // CC is part of MCS
                            }
                            else
                            {
                                return 0; // fixed CC values used, not stored as part of Aux
                            }
                        }
                        else
                        {
                            return (AuxSurf.CCSize);
                        }										
                    }
                }
                else if (GmmAuxType == GMM_AUX_ZCS)
                {
                    if (Surf.Flags.Gpu.UnifiedAuxSurface && AuxSecSurf.Type != RESOURCE_INVALID)
                    {
                        return AuxSecSurf.Size;
                    }
                    else
                    {
                        return 0;
                    }
                }
                else
                {
                    return 0;
                }
            }